

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mulut.h
# Opt level: O3

void __thiscall MulutTertawa::MulutTertawa(MulutTertawa *this)

{
  void *local_a8 [4];
  undefined4 local_88;
  undefined4 uStack_84;
  undefined4 uStack_80;
  undefined4 uStack_7c;
  undefined8 local_78;
  undefined8 local_68;
  undefined8 uStack_60;
  undefined8 local_58;
  undefined8 local_48;
  undefined8 uStack_40;
  undefined8 local_38;
  undefined8 local_28;
  undefined8 uStack_20;
  undefined8 local_18;
  
  Polygon::Polygon(&this->super_Polygon);
  local_28 = 0x406a400000000000;
  uStack_20 = 0x407f400000000000;
  local_18 = 0;
  local_48 = 0x406e000000000000;
  uStack_40 = 0x4080400000000000;
  local_38 = 0;
  local_68 = 0x4072c00000000000;
  uStack_60 = 0x4080400000000000;
  local_58 = 0;
  local_88 = 0;
  uStack_84 = 0x4074a000;
  uStack_80 = 0;
  uStack_7c = 0x407f4000;
  local_78 = 0;
  curve::curve((curve *)local_a8);
  Polygon::addCurve(this,local_a8);
  if (local_a8[0] != (void *)0x0) {
    operator_delete(local_a8[0]);
  }
  Polygon::setColor((int)this,0xa0,0x52,0x2d);
  return;
}

Assistant:

MulutTertawa() {
    //baw
    addCurve(curve(Point<double>(210, 500), Point<double>(240, 520), Point<double>(300, 520), Point<double>(330, 500)));
    //addCurve(curve(Point<double>(330, 500), Point<double>(300, 515), Point<double>(240, 515), Point<double>(210, 500)));
    setColor(160,82,45,0);
  }